

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall CLI::App::immediate_callback(App *this,bool immediate)

{
  bool bVar1;
  bool immediate_local;
  App *this_local;
  
  this->immediate_callback_ = immediate;
  if ((this->immediate_callback_ & 1U) == 0) {
    bVar1 = ::std::function::operator_cast_to_bool((function *)&this->final_callback_);
    if ((!bVar1) &&
       (bVar1 = ::std::function::operator_cast_to_bool((function *)&this->parse_complete_callback_),
       bVar1)) {
      std::swap<void>(&this->final_callback_,&this->parse_complete_callback_);
    }
  }
  else {
    bVar1 = ::std::function::operator_cast_to_bool((function *)&this->final_callback_);
    if ((bVar1) &&
       (bVar1 = ::std::function::operator_cast_to_bool((function *)&this->parse_complete_callback_),
       !bVar1)) {
      std::swap<void>(&this->final_callback_,&this->parse_complete_callback_);
    }
  }
  return this;
}

Assistant:

CLI11_INLINE App *App::immediate_callback(bool immediate) {
    immediate_callback_ = immediate;
    if(immediate_callback_) {
        if(final_callback_ && !(parse_complete_callback_)) {
            std::swap(final_callback_, parse_complete_callback_);
        }
    } else if(!(final_callback_) && parse_complete_callback_) {
        std::swap(final_callback_, parse_complete_callback_);
    }
    return this;
}